

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *data;
  string *str;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  Type *pTVar2;
  uint8 *puVar3;
  Type *this_01;
  int i;
  int iVar4;
  
  this_00 = &this->file_to_generate_;
  for (iVar4 = 0; iVar4 < (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = iVar4 + 1) {
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar4);
    data = (pTVar2->_M_dataplus)._M_p;
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar4);
    internal::WireFormat::VerifyUTF8StringFallback(data,(int)pTVar2->_M_string_length,SERIALIZE);
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar4);
    *target = '\n';
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)pTVar2->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(pTVar2,puVar3);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->parameter_->_M_dataplus)._M_p,(int)this->parameter_->_M_string_length,
               SERIALIZE);
    str = this->parameter_;
    *target = '\x12';
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray((uint32)str->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(str,puVar3);
  }
  for (iVar4 = 0; iVar4 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = iVar4 + 1) {
    this_01 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                        (&(this->proto_file_).super_RepeatedPtrFieldBase,iVar4);
    *target = 'z';
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray(this_01->_cached_size_,target + 1);
    target = FileDescriptorProto::SerializeWithCachedSizesToArray(this_01,puVar3);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar3 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar3;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorRequest::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated string file_to_generate = 1;
  for (int i = 0; i < this->file_to_generate_size(); i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->file_to_generate(i).data(), this->file_to_generate(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1, this->file_to_generate(i), target);
  }

  // optional string parameter = 2;
  if (has_parameter()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->parameter(), target);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (int i = 0; i < this->proto_file_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        15, this->proto_file(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}